

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtipccommon.h
# Opt level: O2

void __thiscall QNativeIpcKey::QNativeIpcKey(QNativeIpcKey *this,QNativeIpcKey *other)

{
  this->d = other->d;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->key).d,&(other->key).d);
  this->typeAndFlags = other->typeAndFlags;
  if (this->d != (QNativeIpcKeyPrivate *)0x0) {
    copy_internal(this,other);
  }
  return;
}

Assistant:

QNativeIpcKey(const QNativeIpcKey &other)
        : d(other.d), key(other.key), typeAndFlags(other.typeAndFlags)
    {
        if (isSlowPath())
            copy_internal(other);
    }